

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::CallInst::display(CallInst *this,ostream *o)

{
  ostream *poVar1;
  size_type sVar2;
  ostream *in_RSI;
  long in_RDI;
  size_t i;
  Displayable *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  ulong local_18;
  
  poVar1 = prelude::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x18));
  std::operator<<(poVar1,"(");
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::size
                      ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                       (in_RDI + 0x38));
    if (sVar2 <= local_18) break;
    if (local_18 != 0) {
      std::operator<<(in_RSI,", ");
    }
    poVar1 = in_RSI;
    std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
              ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)(in_RDI + 0x38),
               local_18);
    prelude::operator<<(poVar1,in_stack_ffffffffffffffc8);
    local_18 = local_18 + 1;
  }
  std::operator<<(in_RSI,")");
  return;
}

Assistant:

void CallInst::display(std::ostream& o) const {
  o << dest << " = " << func << "(";
  for (size_t i = 0; i < params.size(); i++) {
    if (i != 0) o << ", ";
    o << params[i];
  }
  o << ")";
}